

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

stbtt_int32 stbtt__GetGlyphClass(stbtt_uint8 *classDefTable,int glyph)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  uVar2 = *(ushort *)classDefTable << 8 | *(ushort *)classDefTable >> 8;
  if (uVar2 == 2) {
    uVar2 = *(ushort *)(classDefTable + 2) << 8 | *(ushort *)(classDefTable + 2) >> 8;
    if (uVar2 != 0) {
      iVar3 = uVar2 - 1;
      iVar6 = 0;
      do {
        iVar5 = iVar6 + iVar3 >> 1;
        lVar4 = (long)(int)((iVar6 + iVar3 & 0xfffffffeU) * 3);
        if (glyph < (int)(uint)(ushort)(*(ushort *)(classDefTable + lVar4 + 4) << 8 |
                                       *(ushort *)(classDefTable + lVar4 + 4) >> 8)) {
          iVar3 = iVar5 + -1;
        }
        else {
          if ((uint)glyph <=
              (uint)(ushort)(*(ushort *)(classDefTable + lVar4 + 6) << 8 |
                            *(ushort *)(classDefTable + lVar4 + 6) >> 8)) {
            lVar1 = lVar4 + 8;
            lVar4 = lVar4 + 9;
            goto LAB_0012c8b3;
          }
          iVar6 = iVar5 + 1;
        }
      } while (iVar6 <= iVar3);
    }
  }
  else if (uVar2 == 1) {
    uVar2 = *(ushort *)(classDefTable + 2) << 8 | *(ushort *)(classDefTable + 2) >> 8;
    if (((int)(uint)uVar2 <= glyph) &&
       ((uint)glyph <
        (uint)(ushort)(*(ushort *)(classDefTable + 4) << 8 | *(ushort *)(classDefTable + 4) >> 8) +
        (uint)uVar2)) {
      lVar4 = (long)(int)((glyph - (uint)uVar2) * 2);
      lVar1 = lVar4 + 6;
      lVar4 = lVar4 + 7;
LAB_0012c8b3:
      return (uint)CONCAT11(classDefTable[lVar1],classDefTable[lVar4]);
    }
  }
  return -1;
}

Assistant:

static stbtt_int32  stbtt__GetGlyphClass(stbtt_uint8 *classDefTable, int glyph)
{
stbtt_uint16 classDefFormat = ttUSHORT(classDefTable);
switch(classDefFormat)
{
case 1: {
stbtt_uint16 startGlyphID = ttUSHORT(classDefTable + 2);
stbtt_uint16 glyphCount = ttUSHORT(classDefTable + 4);
stbtt_uint8 *classDef1ValueArray = classDefTable + 6;

if (glyph >= startGlyphID && glyph < startGlyphID + glyphCount)
return (stbtt_int32)ttUSHORT(classDef1ValueArray + 2 * (glyph - startGlyphID));

classDefTable = classDef1ValueArray + 2 * glyphCount;
} break;

case 2: {
stbtt_uint16 classRangeCount = ttUSHORT(classDefTable + 2);
stbtt_uint8 *classRangeRecords = classDefTable + 4;

/*  Binary search. */
stbtt_int32 l=0, r=classRangeCount-1, m;
int strawStart, strawEnd, needle=glyph;
while (l <= r) {
stbtt_uint8 *classRangeRecord;
m = (l + r) >> 1;
classRangeRecord = classRangeRecords + 6 * m;
strawStart = ttUSHORT(classRangeRecord);
strawEnd = ttUSHORT(classRangeRecord + 2);
if (needle < strawStart)
r = m - 1;
else if (needle > strawEnd)
l = m + 1;
else
return (stbtt_int32)ttUSHORT(classRangeRecord + 4);
}

classDefTable = classRangeRecords + 6 * classRangeCount;
} break;

default: {
/*  There are no other cases. */
STBTT_assert(0);
} break;
}

return -1;
}